

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *p)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_20a;
  allocator<char> local_209;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  Printer *p_local;
  undefined1 local_1a0 [64];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"init_impl",&local_209);
    local_1a0._0_8_ = local_1a0 + 0x10;
    if (local_1e8 == local_1d8) {
      local_1a0._24_8_ = uStack_1d0;
    }
    else {
      local_1a0._0_8_ = local_1e8;
    }
    local_1a0._8_8_ = local_1e0;
    local_1e0 = 0;
    local_1d8[0] = 0;
    local_1b8 = (code *)0x0;
    pcStack_1b0 = (code *)0x0;
    local_1c8._M_unused._M_object = (void *)0x0;
    local_1c8._8_8_ = 0;
    local_1e8 = local_1d8;
    local_1c8._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_1c8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_1c8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_1c8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_1b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_1b8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1a0 + 0x20),
               (function<bool_()> *)&local_1c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"zero_init",&local_20a);
    local_e8 = local_d8;
    if (local_208 == local_1f8) {
      uStack_d0 = uStack_1f0;
    }
    else {
      local_e8 = local_208;
    }
    local_e0 = local_200;
    local_200 = 0;
    local_1f8[0] = 0;
    local_1b8 = (code *)0x0;
    pcStack_1b0 = (code *)0x0;
    local_1c8._M_unused._M_object = (void *)0x0;
    local_1c8._8_8_ = 0;
    local_208 = local_1f8;
    local_1c8._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_1c8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_1c8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_1c8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_1b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_1b8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_1c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    google::protobuf::io::Printer::Emit
              (p,local_1a0,2,0x197,
               "\n            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(\n                $pbi$::InternalVisibility visibility,\n                ::$proto_ns$::Arena* arena)\n                //~\n                $init_impl$ {}\n\n            inline void $classname$::SharedCtor(::_pb::Arena* arena) {\n              new (&_impl_) Impl_(internal_visibility(), arena);\n              $zero_init$;\n            }\n          "
              );
    lVar2 = 0xb8;
    do {
      io::Printer::Sub::~Sub((Sub *)(local_1a0 + lVar2));
      lVar2 = lVar2 + -0xb8;
    } while (lVar2 != -0xb8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedConstructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;

  // Generate Impl_::Imp_(visibility, Arena*);
  p->Emit({{"init_impl", [&] { GenerateImplMemberInit(p, InitType::kArena); }},
           {"zero_init", [&] { GenerateZeroInitFields(p); }}},
          R"cc(
            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(
                $pbi$::InternalVisibility visibility,
                ::$proto_ns$::Arena* arena)
                //~
                $init_impl$ {}

            inline void $classname$::SharedCtor(::_pb::Arena* arena) {
              new (&_impl_) Impl_(internal_visibility(), arena);
              $zero_init$;
            }
          )cc");
}